

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

Result<wallet::SelectionResult> *
wallet::SelectCoins(Result<wallet::SelectionResult> *__return_storage_ptr__,CWallet *wallet,
                   CoinsResult *available_coins,PreSelectedInputs *pre_set_inputs,
                   CAmount *nTargetValue,CCoinControl *coin_control,
                   CoinSelectionParams *coin_selection_params)

{
  undefined8 *puVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  _Rb_tree_color _Var9;
  _Rb_tree_color _Var10;
  T *pTVar11;
  int iVar12;
  optional<long> *poVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  size_t *psVar17;
  long in_FS_OFFSET;
  CAmount selection_target;
  SelectionResult preselected;
  Result<wallet::SelectionResult> op_selection_result;
  long local_248;
  bilingual_str local_240;
  SelectionResult local_200;
  undefined1 local_190 [40];
  size_t local_168 [9];
  __index_type local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_e0 [8];
  _Rb_tree_node_base local_d8;
  size_t local_b8;
  long local_b0;
  undefined8 uStack_a8;
  _Storage<long,_true> local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  size_t sStack_88;
  undefined8 local_80;
  CAmount CStack_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_248 = *nTargetValue - pre_set_inputs->total_amount;
  if (local_248 < 1 || coin_control->m_allow_other_inputs != false) {
    if (local_248 < 1) {
      p_Var15 = (_Rb_tree_node_base *)(local_190 + 8);
      local_190._8_4_ = _S_red;
      local_190._16_8_ = (_Base_ptr)0x0;
      local_168[0] = 0;
      local_168[2]._0_1_ = MANUAL;
      local_168[2]._1_1_ = false;
      local_168[4]._0_1_ = false;
      local_168[5]._0_1_ = true;
      local_168[7]._0_4_ = 0;
      local_168[8] = 0;
      local_190._24_8_ = p_Var15;
      local_190._32_8_ = p_Var15;
      local_168[1] = *nTargetValue;
      SelectionResult::AddInputs
                ((SelectionResult *)local_190,&pre_set_inputs->coins,
                 coin_selection_params->m_subtract_fee_outputs);
      SelectionResult::RecalculateWaste
                ((SelectionResult *)local_190,coin_selection_params->min_viable_change,
                 coin_selection_params->m_cost_of_change,coin_selection_params->m_change_fee);
      uVar8 = local_190._16_8_;
      if ((_Base_ptr)local_190._16_8_ == (_Base_ptr)0x0) {
        psVar17 = &local_b8;
        local_d8._M_parent = (_Base_ptr)0x0;
        _Var9 = _S_red;
        p_Var14 = &local_d8;
        p_Var16 = &local_d8;
      }
      else {
        psVar17 = local_168;
        local_d8._M_parent = (_Base_ptr)local_190._16_8_;
        *(_Rb_tree_node_base **)(local_190._16_8_ + 8) = &local_d8;
        local_b8 = local_168[0];
        local_190._16_8_ = (_Base_ptr)0x0;
        p_Var14 = (_Rb_tree_node_base *)local_190._24_8_;
        p_Var16 = (_Rb_tree_node_base *)local_190._32_8_;
        _Var9 = local_190._8_4_;
        local_190._24_8_ = p_Var15;
        local_190._32_8_ = p_Var15;
      }
      local_d8._M_left = p_Var14;
      local_d8._M_right = p_Var16;
      *psVar17 = 0;
      uStack_a8 = CONCAT62(local_168[2]._2_6_,(undefined2)local_168[2]);
      uStack_98 = CONCAT71(local_168[4]._1_7_,(undefined1)local_168[4]);
      local_90 = CONCAT71(local_168[5]._1_7_,(undefined1)local_168[5]);
      local_80 = CONCAT44(local_168[7]._4_4_,(undefined4)local_168[7]);
      local_b0 = local_168[1];
      local_a0 = (_Storage<long,_true>)local_168[3];
      sStack_88 = local_168[6];
      CStack_78 = local_168[8];
      p_Var15 = (_Rb_tree_node_base *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
                8);
      if ((_Base_ptr)uVar8 == (_Base_ptr)0x0) {
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10) =
             0;
        psVar17 = (size_t *)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u
                  + 0x28);
        _Var10 = _S_red;
        p_Var16 = p_Var15;
      }
      else {
        psVar17 = &local_b8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10) =
             uVar8;
        *(_Rb_tree_node_base **)(uVar8 + 8) = p_Var15;
        *(size_t *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28) =
             local_b8;
        local_d8._M_parent = (_Base_ptr)0x0;
        p_Var15 = p_Var14;
        _Var10 = _Var9;
        local_d8._M_left = &local_d8;
        local_d8._M_right = &local_d8;
      }
      *(_Rb_tree_node_base **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) =
           p_Var15;
      *(_Rb_tree_node_base **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
           p_Var16;
      *psVar17 = 0;
      *(_Rb_tree_color *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
           _Var10;
      *(long *)((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
               0x30) = local_b0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38) =
           uStack_a8;
      *(_Storage<long,_true> *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x40) =
           local_a0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x48) =
           uStack_98;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x50) =
           local_90;
      *(size_t *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x58) =
           sStack_88;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x60) =
           local_80;
      *(CAmount *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x68) =
           CStack_78;
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\x01';
      local_d8._M_color = _Var9;
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree(local_e0);
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)local_190);
      goto LAB_0050dd07;
    }
    if (coin_selection_params->m_subtract_fee_outputs == true) {
      poVar13 = (optional<long> *)&available_coins->total_amount;
LAB_0050da74:
      if (local_248 <=
          (poVar13->super__Optional_base<long,_true,_true>)._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value) {
        AutomaticCoinSelection
                  ((Result<wallet::SelectionResult> *)local_190,wallet,available_coins,&local_248,
                   coin_selection_params);
        if ((local_120 == '\x01') &&
           ((pre_set_inputs->coins)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
          local_200.m_target = pre_set_inputs->total_amount;
          local_200.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_200.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
          local_200.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          local_200.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_200.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_200.m_algo = MANUAL;
          local_200.m_use_effective = false;
          local_200.m_waste.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged = false;
          local_200.m_algo_completed = true;
          local_200.m_weight = 0;
          local_200.bump_fee_group_discount = 0;
          local_200.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_200.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          SelectionResult::AddInputs
                    (&local_200,&pre_set_inputs->coins,coin_selection_params->m_subtract_fee_outputs
                    );
          pTVar11 = util::Result<wallet::SelectionResult>::value
                              ((Result<wallet::SelectionResult> *)local_190);
          SelectionResult::Merge(pTVar11,&local_200);
          pTVar11 = util::Result<wallet::SelectionResult>::value
                              ((Result<wallet::SelectionResult> *)local_190);
          SelectionResult::RecalculateWaste
                    (pTVar11,coin_selection_params->min_viable_change,
                     coin_selection_params->m_cost_of_change,coin_selection_params->m_change_fee);
          bVar5 = (coin_selection_params->m_max_tx_weight).super__Optional_base<int,_true,_true>.
                  _M_payload.super__Optional_payload_base<int>._M_engaged;
          iVar6 = coin_selection_params->tx_noinputs_size;
          iVar7 = (coin_selection_params->m_max_tx_weight).super__Optional_base<int,_true,_true>.
                  _M_payload.super__Optional_payload_base<int>._M_payload._M_value;
          pTVar11 = util::Result<wallet::SelectionResult>::value
                              ((Result<wallet::SelectionResult> *)local_190);
          iVar12 = 400000;
          if (bVar5 != false) {
            iVar12 = iVar7;
          }
          if (pTVar11->m_weight <= iVar12 + iVar6 * -4) {
            _GLOBAL__N_1::std::
            _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                         *)&local_200);
            goto LAB_0050dcea;
          }
          _(&local_240,(ConstevalStringLiteral)0x85715a);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u
                   + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = puVar1;
          paVar3 = &local_240.original.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240.original._M_dataplus._M_p == paVar3) {
            *puVar1 = CONCAT71(local_240.original.field_2._M_allocated_capacity._1_7_,
                               local_240.original.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x18) = local_240.original.field_2._8_8_;
          }
          else {
            *(pointer *)
             &(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::SelectionResult>.
              super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
                 local_240.original._M_dataplus._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>.
                              _M_u + 0x10) =
                 CONCAT71(local_240.original.field_2._M_allocated_capacity._1_7_,
                          local_240.original.field_2._M_local_buf[0]);
          }
          paVar4 = &local_240.translated.field_2;
          *(size_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
               local_240.original._M_string_length;
          local_240.original._M_string_length = 0;
          local_240.original.field_2._M_local_buf[0] = '\0';
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u
                   + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20)
               = puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240.translated._M_dataplus._M_p == paVar4) {
            *puVar1 = CONCAT71(local_240.translated.field_2._M_allocated_capacity._1_7_,
                               local_240.translated.field_2._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x38) = local_240.translated.field_2._8_8_;
          }
          else {
            *(pointer *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x20) = local_240.translated._M_dataplus._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>.
                              _M_u + 0x30) =
                 CONCAT71(local_240.translated.field_2._M_allocated_capacity._1_7_,
                          local_240.translated.field_2._M_local_buf[0]);
          }
          *(size_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28)
               = local_240.translated._M_string_length;
          local_240.translated._M_string_length = 0;
          local_240.translated.field_2._M_local_buf[0] = '\0';
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
          local_240.original._M_dataplus._M_p = (pointer)paVar3;
          local_240.translated._M_dataplus._M_p = (pointer)paVar4;
          util::Error::~Error((Error *)&local_240);
          _GLOBAL__N_1::std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       *)&local_200);
        }
        else {
LAB_0050dcea:
          std::__detail::__variant::_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult>::
          _Move_ctor_base((_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                          __return_storage_ptr__,
                          (_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                          local_190);
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                          local_190);
        goto LAB_0050dd07;
      }
    }
    else if (((available_coins->total_effective_amount).super__Optional_base<long,_true,_true>.
              _M_payload.super__Optional_payload_base<long>._M_engaged & 1U) != 0) {
      poVar13 = &available_coins->total_effective_amount;
      goto LAB_0050da74;
    }
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    *(undefined1 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) = 0;
    local_50._M_string_length = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) = 0;
    *(undefined1 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x30);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x30) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38) = 0;
  }
  else {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "The preselected coins total amount does not cover the transaction target. Please allow other inputs to be automatically selected or include more coins manually"
               ,"");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "The preselected coins total amount does not cover the transaction target. Please allow other inputs to be automatically selected or include more coins manually"
                 ,"");
    }
    else {
      local_190._0_8_ =
           "The preselected coins total amount does not cover the transaction target. Please allow other inputs to be automatically selected or include more coins manually"
      ;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_50,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_190);
    }
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = puVar1;
    if (local_70 == &local_60) {
      *puVar1 = local_60;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x18) =
           uStack_58;
    }
    else {
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> = local_70;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x10) =
           local_60;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 8) =
         local_68;
    psVar2 = (size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u +
             0x30);
    *(size_type **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
         psVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      *psVar2 = local_50.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x38) =
           local_50.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x20) =
           local_50._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x30) =
           local_50.field_2._M_allocated_capacity;
    }
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u + 0x28) =
       local_50._M_string_length;
  (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
  super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index = '\0';
LAB_0050dd07:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> SelectCoins(const CWallet& wallet, CoinsResult& available_coins, const PreSelectedInputs& pre_set_inputs,
                                          const CAmount& nTargetValue, const CCoinControl& coin_control,
                                          const CoinSelectionParams& coin_selection_params)
{
    // Deduct preset inputs amount from the search target
    CAmount selection_target = nTargetValue - pre_set_inputs.total_amount;

    // Return if automatic coin selection is disabled, and we don't cover the selection target
    if (!coin_control.m_allow_other_inputs && selection_target > 0) {
        return util::Error{_("The preselected coins total amount does not cover the transaction target. "
                             "Please allow other inputs to be automatically selected or include more coins manually")};
    }

    // Return if we can cover the target only with the preset inputs
    if (selection_target <= 0) {
        SelectionResult result(nTargetValue, SelectionAlgorithm::MANUAL);
        result.AddInputs(pre_set_inputs.coins, coin_selection_params.m_subtract_fee_outputs);
        result.RecalculateWaste(coin_selection_params.min_viable_change, coin_selection_params.m_cost_of_change, coin_selection_params.m_change_fee);
        return result;
    }

    // Return early if we cannot cover the target with the wallet's UTXO.
    // We use the total effective value if we are not subtracting fee from outputs and 'available_coins' contains the data.
    CAmount available_coins_total_amount = coin_selection_params.m_subtract_fee_outputs ? available_coins.GetTotalAmount() :
            (available_coins.GetEffectiveTotalAmount().has_value() ? *available_coins.GetEffectiveTotalAmount() : 0);
    if (selection_target > available_coins_total_amount) {
        return util::Error(); // Insufficient funds
    }

    // Start wallet Coin Selection procedure
    auto op_selection_result = AutomaticCoinSelection(wallet, available_coins, selection_target, coin_selection_params);
    if (!op_selection_result) return op_selection_result;

    // If needed, add preset inputs to the automatic coin selection result
    if (!pre_set_inputs.coins.empty()) {
        SelectionResult preselected(pre_set_inputs.total_amount, SelectionAlgorithm::MANUAL);
        preselected.AddInputs(pre_set_inputs.coins, coin_selection_params.m_subtract_fee_outputs);
        op_selection_result->Merge(preselected);
        op_selection_result->RecalculateWaste(coin_selection_params.min_viable_change,
                                                coin_selection_params.m_cost_of_change,
                                                coin_selection_params.m_change_fee);

        // Verify we haven't exceeded the maximum allowed weight
        int max_inputs_weight = coin_selection_params.m_max_tx_weight.value_or(MAX_STANDARD_TX_WEIGHT) - (coin_selection_params.tx_noinputs_size * WITNESS_SCALE_FACTOR);
        if (op_selection_result->GetWeight() > max_inputs_weight) {
            return util::Error{_("The combination of the pre-selected inputs and the wallet automatic inputs selection exceeds the transaction maximum weight. "
                                 "Please try sending a smaller amount or manually consolidating your wallet's UTXOs")};
        }
    }
    return op_selection_result;
}